

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int optimize_scope_make_global_ref
              (JSContext *ctx,JSFunctionDef *s,DynBuf *bc,uint8_t *bc_buf,LabelSlot *ls,int pos_next
              ,JSAtom var_name)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  JSAtom val;
  uint8_t *tab;
  long in_RCX;
  JSContext *in_RDX;
  long in_RSI;
  long in_R8;
  int in_R9D;
  bool bVar4;
  BOOL is_strict;
  int op;
  int pos;
  int end_pos;
  int label_pos;
  uint32_t in_stack_ffffffffffffff9c;
  DynBuf *in_stack_ffffffffffffffa0;
  JSAtom in_stack_ffffffffffffffac;
  JSContext *in_stack_ffffffffffffffb0;
  undefined1 local_3c;
  int local_38;
  int local_2c;
  
  bVar4 = (*(byte *)(in_RSI + 0x86) & 1) == 0;
  if (!bVar4) {
    dbuf_putc(in_stack_ffffffffffffffa0,(uint8_t)(in_stack_ffffffffffffff9c >> 0x18));
    JS_DupAtom(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    dbuf_put_u32(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  local_2c = in_R9D;
  if (*(char *)(in_RCX + in_R9D) == '<') {
    dbuf_putc(in_stack_ffffffffffffffa0,(uint8_t)(in_stack_ffffffffffffff9c >> 0x18));
    JS_DupAtom(in_RDX,in_stack_ffffffffffffffac);
    dbuf_put_u32(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    local_2c = in_R9D + 1;
    in_stack_ffffffffffffffb0 = in_RDX;
  }
  iVar1 = *(int *)(in_R8 + 4);
  iVar2 = iVar1 + -5;
  uVar3 = (uint)*(byte *)(in_RCX + iVar1);
  local_38 = iVar2;
  if (bVar4) {
    if (uVar3 == 0x16) {
      *(undefined1 *)(in_RCX + iVar2) = 0x11;
      local_38 = iVar1 + -4;
    }
  }
  else if (uVar3 != 0xb1) {
    if (uVar3 == 0x16) {
      local_3c = 0x15;
    }
    else if (uVar3 == 0x19) {
      local_3c = 0x18;
    }
    else {
      if (uVar3 != 0x1d) {
        abort();
      }
      local_3c = 0x1b;
    }
    local_38 = iVar1 + -4;
    *(undefined1 *)(in_RCX + iVar2) = local_3c;
    in_stack_ffffffffffffffac = uVar3;
  }
  if (bVar4) {
    *(undefined1 *)(in_RCX + local_38) = 0x39;
  }
  else {
    *(undefined1 *)(in_RCX + local_38) = 0x3b;
  }
  tab = (uint8_t *)(in_RCX + local_38 + 1);
  val = JS_DupAtom(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  put_u32(tab,val);
  local_38 = local_38 + 5;
  while (local_38 < iVar1 + 2) {
    *(undefined1 *)(in_RCX + local_38) = 0xb1;
    local_38 = local_38 + 1;
  }
  return local_2c;
}

Assistant:

static int optimize_scope_make_global_ref(JSContext *ctx, JSFunctionDef *s,
                                          DynBuf *bc, uint8_t *bc_buf,
                                          LabelSlot *ls, int pos_next,
                                          JSAtom var_name)
{
    int label_pos, end_pos, pos, op;
    BOOL is_strict;
    is_strict = ((s->js_mode & JS_MODE_STRICT) != 0);

    /* replace the reference get/put with normal variable
       accesses */
    if (is_strict) {
        /* need to check if the variable exists before evaluating the right
           expression */
        /* XXX: need an extra OP_true if destructuring an array */
        dbuf_putc(bc, OP_check_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
    } else {
        /* XXX: need 2 extra OP_true if destructuring an array */
    }
    if (bc_buf[pos_next] == OP_get_ref_value) {
        dbuf_putc(bc, OP_get_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        pos_next++;
    }
    /* remove the OP_label to make room for replacement */
    /* label should have a refcount of 0 anyway */
    /* XXX: should have emitted several OP_nop to avoid this kludge */
    label_pos = ls->pos;
    pos = label_pos - 5;
    assert(bc_buf[pos] == OP_label);
    end_pos = label_pos + 2;
    op = bc_buf[label_pos];
    if (is_strict) {
        if (op != OP_nop) {
            switch(op) {
            case OP_insert3:
                op = OP_insert2;
                break;
            case OP_perm4:
                op = OP_perm3;
                break;
            case OP_rot3l:
                op = OP_swap;
                break;
            default:
                abort();
            }
            bc_buf[pos++] = op;
        }
    } else {
        if (op == OP_insert3)
            bc_buf[pos++] = OP_dup;
    }
    if (is_strict) {
        bc_buf[pos] = OP_put_var_strict;
        /* XXX: need 1 extra OP_drop if destructuring an array */
    } else {
        bc_buf[pos] = OP_put_var;
        /* XXX: need 2 extra OP_drop if destructuring an array */
    }
    put_u32(bc_buf + pos + 1, JS_DupAtom(ctx, var_name));
    pos += 5;
    /* pad with OP_nop */
    while (pos < end_pos)
        bc_buf[pos++] = OP_nop;
    return pos_next;
}